

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::MILSpec::TupleValue::TupleValue(TupleValue *this,TupleValue *from)

{
  TupleValue *from_local;
  TupleValue *this_local;
  
  google::protobuf::MessageLite::MessageLite(&this->super_MessageLite);
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__TupleValue_006f09d0;
  google::protobuf::RepeatedPtrField<CoreML::Specification::MILSpec::Value>::RepeatedPtrField
            (&this->values_,&from->values_);
  google::protobuf::internal::CachedSize::CachedSize(&this->_cached_size_);
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_,
             &(from->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

TupleValue::TupleValue(const TupleValue& from)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite(),
      values_(from.values_) {
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.MILSpec.TupleValue)
}